

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::UpdateArrayBailOutKind(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind e1;
  undefined4 *puVar4;
  Opnd *pOVar5;
  IndirOpnd *pIVar6;
  ArrayRegOpnd *this_00;
  Instr *this_01;
  Instr *upperBoundCheck;
  BailOutKind includeBailOutKinds;
  ValueType baseValueType;
  RegOpnd *baseOpnd;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar2 = IsPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1451,"(!IsPrePass())","!IsPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1452,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = IR::Instr::HasBailOutInfo(instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1453,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((((instr->m_opcode != StElemI_A) && (instr->m_opcode != StElemI_A_Strict)) &&
      (instr->m_opcode != Memcopy)) && (instr->m_opcode != Memset)) {
    return;
  }
  pOVar5 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsIndirOpnd(pOVar5);
  if (!bVar2) {
    return;
  }
  pOVar5 = IR::Instr::GetDst(instr);
  pIVar6 = IR::Opnd::AsIndirOpnd(pOVar5);
  _includeBailOutKinds = IR::IndirOpnd::GetBaseOpnd(pIVar6);
  upperBoundCheck._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&_includeBailOutKinds->super_Opnd);
  bVar2 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)((long)&upperBoundCheck + 6));
  if (bVar2) {
    return;
  }
  pOVar5 = IR::Instr::GetDst(instr);
  pIVar6 = IR::Opnd::AsIndirOpnd(pOVar5);
  IR::IndirOpnd::AllowConversion(pIVar6,true);
  upperBoundCheck._0_4_ = BailOutInvalid;
  bVar2 = ValueType::IsNotNativeArray((ValueType *)((long)&upperBoundCheck + 6));
  if ((!bVar2) &&
     (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        (this->currentBlock->noImplicitCallNativeArrayUses), !bVar2)) {
    BVar3 = IR::Instr::GetBailOutKind(instr);
    BVar3 = IR::operator&(BVar3,BailOutOnArrayAccessHelperCall);
    bVar2 = IR::operator!(BVar3);
    if (bVar2) {
      bVar2 = ValueType::IsLikelyNativeArray((ValueType *)((long)&upperBoundCheck + 6));
      if (bVar2) {
        pOVar5 = IR::Instr::GetSrc1(instr);
        bVar2 = IR::Opnd::IsVar(pOVar5);
        if (!bVar2) {
          pOVar5 = IR::Instr::GetDst(instr);
          pIVar6 = IR::Opnd::AsIndirOpnd(pOVar5);
          IR::IndirOpnd::AllowConversion(pIVar6,false);
          goto LAB_004d2161;
        }
      }
      IR::operator|=((BailOutKind *)&upperBoundCheck,BailOutConvertedNativeArray);
    }
  }
LAB_004d2161:
  bVar2 = IR::RegOpnd::IsArrayRegOpnd(_includeBailOutKinds);
  if (bVar2) {
    this_00 = IR::RegOpnd::AsArrayRegOpnd(_includeBailOutKinds);
    bVar2 = IR::ArrayRegOpnd::EliminatedUpperBoundCheck(this_00);
    if (bVar2) {
      if (((*(ushort *)&instr->field_0x36 >> 0xc & 1) != 0) &&
         (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                            (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses), !bVar2))
      {
        this_01 = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
        if ((this_01 == (Instr *)0x0) || (this_01 == instr)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1481,"(upperBoundCheck && upperBoundCheck != instr)",
                             "upperBoundCheck && upperBoundCheck != instr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        BVar3 = IR::Instr::GetBailOutKind(this_01);
        if (BVar3 == BailOutOnArrayAccessHelperCall) {
          IR::Instr::SetBailOutKind(this_01,BailOutOnInvalidatedArrayHeadSegment);
        }
        else {
          BVar3 = IR::Instr::GetBailOutKind(this_01);
          if (BVar3 != BailOutOnFailedHoistedBoundCheck) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1489,
                               "(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck)"
                               ,
                               "upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
      }
      goto LAB_004d23a3;
    }
  }
  bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses);
  if (bVar2) {
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      (this->currentBlock->noImplicitCallNoMissingValuesUses);
    if (!bVar2) {
      BVar3 = IR::Instr::GetBailOutKind(instr);
      BVar3 = IR::operator&(BVar3,BailOutOnArrayAccessHelperCall);
      bVar2 = IR::operator!(BVar3);
      if (bVar2) {
        IR::operator|=((BailOutKind *)&upperBoundCheck,BailOutOnMissingValue);
      }
    }
  }
  else {
    IR::operator|=((BailOutKind *)&upperBoundCheck,BailOutOnInvalidatedArrayHeadSegment);
  }
  bVar2 = ValueType::IsNotArray((ValueType *)((long)&upperBoundCheck + 6));
  if ((!bVar2) &&
     (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        (this->currentBlock->noImplicitCallArrayLengthSymUses), !bVar2)) {
    IR::operator|=((BailOutKind *)&upperBoundCheck,BailOutOnInvalidatedArrayLength);
  }
LAB_004d23a3:
  bVar2 = IR::operator!((BailOutKind)upperBoundCheck);
  BVar3 = (BailOutKind)upperBoundCheck;
  if (!bVar2) {
    e1 = IR::operator~(BailOutKindBits);
    BVar3 = IR::operator&(BVar3,e1);
    bVar2 = IR::operator!(BVar3);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x14af,"(!(includeBailOutKinds & ~IR::BailOutKindBits))",
                         "!(includeBailOutKinds & ~IR::BailOutKindBits)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = IR::Instr::GetBailOutKind(instr);
    BVar3 = IR::operator|(BVar3,(BailOutKind)upperBoundCheck);
    IR::Instr::SetBailOutKind(instr,BVar3);
  }
  return;
}

Assistant:

void
BackwardPass::UpdateArrayBailOutKind(IR::Instr *const instr)
{
    Assert(!IsPrePass());
    Assert(instr);
    Assert(instr->HasBailOutInfo());

    if ((instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict &&
        instr->m_opcode != Js::OpCode::Memcopy && instr->m_opcode != Js::OpCode::Memset) ||
        !instr->GetDst()->IsIndirOpnd())
    {
        return;
    }

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    if(baseValueType.IsNotArrayOrObjectWithArray())
    {
        return;
    }

    instr->GetDst()->AsIndirOpnd()->AllowConversion(true);
    IR::BailOutKind includeBailOutKinds = IR::BailOutInvalid;
    if (!baseValueType.IsNotNativeArray() &&
        !currentBlock->noImplicitCallNativeArrayUses->IsEmpty() &&
        !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
    {
        // There is an upwards-exposed use of a native array. Since the array referenced by this instruction can be aliased,
        // this instruction needs to bail out if it converts the native array even if this array specifically is not
        // upwards-exposed.
        if (!baseValueType.IsLikelyNativeArray() || instr->GetSrc1()->IsVar())
        {
            includeBailOutKinds |= IR::BailOutConvertedNativeArray;
        }
        else
        {
            // We are assuming that array conversion is impossible here, so make sure we execute code that fails if conversion does happen.
            instr->GetDst()->AsIndirOpnd()->AllowConversion(false);
        }
    }

    if(baseOpnd->IsArrayRegOpnd() && baseOpnd->AsArrayRegOpnd()->EliminatedUpperBoundCheck())
    {
        if(instr->extractedUpperBoundCheckWithoutHoisting && !currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // See comment below regarding head segment invalidation. A failed upper bound check usually means that it will
            // invalidate the head segment length, so change the bailout kind on the upper bound check to have it bail out for
            // the right reason. Even though the store may actually occur in a non-head segment, which would not invalidate the
            // head segment or length, any store outside the head segment bounds causes head segment load elimination to be
            // turned off for the store, because the segment structure of the array is not guaranteed to be the same every time.
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);

            if(upperBoundCheck->GetBailOutKind() == IR::BailOutOnArrayAccessHelperCall)
            {
                upperBoundCheck->SetBailOutKind(IR::BailOutOnInvalidatedArrayHeadSegment);
            }
            else
            {
                Assert(upperBoundCheck->GetBailOutKind() == IR::BailOutOnFailedHoistedBoundCheck);
            }
        }
    }
    else
    {
        if(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a segment sym. Since the head segment syms referenced by this instruction can
            // be aliased, this instruction needs to bail out if it changes the segment syms it references even if the ones it
            // references specifically are not upwards-exposed. This bailout kind also guarantees that this element store will
            // not create missing values.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayHeadSegment;
        }
        else if(
            !currentBlock->noImplicitCallNoMissingValuesUses->IsEmpty() &&
            !(instr->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall))
        {
            // There is an upwards-exposed use of an array with no missing values. Since the array referenced by this
            // instruction can be aliased, this instruction needs to bail out if it creates a missing value in the array even if
            // this array specifically is not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnMissingValue;
        }

        if(!baseValueType.IsNotArray() && !currentBlock->noImplicitCallArrayLengthSymUses->IsEmpty())
        {
            // There is an upwards-exposed use of a length sym. Since the length sym referenced by this instruction can be
            // aliased, this instruction needs to bail out if it changes the length sym it references even if the ones it
            // references specifically are not upwards-exposed.
            includeBailOutKinds |= IR::BailOutOnInvalidatedArrayLength;
        }
    }

    if(!includeBailOutKinds)
    {
        return;
    }

    Assert(!(includeBailOutKinds & ~IR::BailOutKindBits));
    instr->SetBailOutKind(instr->GetBailOutKind() | includeBailOutKinds);
}